

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LinearQuantizationParams * __thiscall
CoreML::Specification::QuantizationParams::_internal_mutable_linearquantization
          (QuantizationParams *this)

{
  ulong uVar1;
  LinearQuantizationParams *pLVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x65) {
    pLVar2 = (this->QuantizationType_).linearquantization_;
  }
  else {
    clear_QuantizationType(this);
    this->_oneof_case_[0] = 0x65;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pLVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(arena);
    (this->QuantizationType_).linearquantization_ = pLVar2;
  }
  return pLVar2;
}

Assistant:

inline ::CoreML::Specification::LinearQuantizationParams* QuantizationParams::_internal_mutable_linearquantization() {
  if (!_internal_has_linearquantization()) {
    clear_QuantizationType();
    set_has_linearquantization();
    QuantizationType_.linearquantization_ = CreateMaybeMessage< ::CoreML::Specification::LinearQuantizationParams >(GetArenaForAllocation());
  }
  return QuantizationType_.linearquantization_;
}